

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm.h
# Opt level: O0

void get_flip_cfg(TX_TYPE tx_type,int *ud_flip,int *lr_flip)

{
  int *lr_flip_local;
  int *ud_flip_local;
  TX_TYPE tx_type_local;
  
  switch(tx_type) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x03':
    *ud_flip = 0;
    *lr_flip = 0;
    break;
  case '\x04':
  case '\b':
  case '\x0e':
    *ud_flip = 1;
    *lr_flip = 0;
    break;
  case '\x05':
  case '\a':
  case '\x0f':
    *ud_flip = 0;
    *lr_flip = 1;
    break;
  case '\x06':
    *ud_flip = 1;
    *lr_flip = 1;
    break;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
    *ud_flip = 0;
    *lr_flip = 0;
    break;
  default:
    *ud_flip = 0;
    *lr_flip = 0;
  }
  return;
}

Assistant:

static inline void get_flip_cfg(TX_TYPE tx_type, int *ud_flip, int *lr_flip) {
  switch (tx_type) {
    case DCT_DCT:
    case ADST_DCT:
    case DCT_ADST:
    case ADST_ADST:
      *ud_flip = 0;
      *lr_flip = 0;
      break;
    case IDTX:
    case V_DCT:
    case H_DCT:
    case V_ADST:
    case H_ADST:
      *ud_flip = 0;
      *lr_flip = 0;
      break;
    case FLIPADST_DCT:
    case FLIPADST_ADST:
    case V_FLIPADST:
      *ud_flip = 1;
      *lr_flip = 0;
      break;
    case DCT_FLIPADST:
    case ADST_FLIPADST:
    case H_FLIPADST:
      *ud_flip = 0;
      *lr_flip = 1;
      break;
    case FLIPADST_FLIPADST:
      *ud_flip = 1;
      *lr_flip = 1;
      break;
    default:
      *ud_flip = 0;
      *lr_flip = 0;
      assert(0);
  }
}